

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int read_chunk_bytes(spng_ctx *ctx,uint32_t bytes)

{
  size_t *psVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  
  iVar3 = 0x50;
  if ((bytes - 1 < ctx->cur_chunk_bytes_left) &&
     ((bytes < 0x2001 || ((*(ushort *)&ctx->field_0xcc & 1) == 0)))) {
    uVar6 = (ulong)bytes;
    iVar4 = (*(code *)ctx->read_fn)(ctx,ctx->stream_user_ptr,ctx->stream_buf,uVar6);
    if (iVar4 == 0) {
      iVar3 = 3;
      psVar1 = &ctx->bytes_read;
      uVar2 = *psVar1;
      *psVar1 = *psVar1 + uVar6;
      if (!CARRY8(uVar2,uVar6)) {
        if ((ctx->field_0xcc & 0x80) == 0) {
          uVar5 = crc32(ctx->cur_actual_crc,ctx->data,bytes);
          ctx->cur_actual_crc = uVar5;
        }
        ctx->cur_chunk_bytes_left = ctx->cur_chunk_bytes_left - bytes;
        iVar3 = 0;
      }
    }
    else {
      iVar3 = -2;
      if (iVar4 == -1) {
        iVar3 = -1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int read_chunk_bytes(spng_ctx *ctx, uint32_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!ctx->cur_chunk_bytes_left || !bytes) return SPNG_EINTERNAL;
    if(bytes > ctx->cur_chunk_bytes_left) return SPNG_EINTERNAL; /* XXX: more specific error? */

    int ret;

    ret = read_data(ctx, bytes);
    if(ret) return ret;

    if(!ctx->skip_crc) ctx->cur_actual_crc = crc32(ctx->cur_actual_crc, ctx->data, bytes);

    ctx->cur_chunk_bytes_left -= bytes;

    return ret;
}